

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

int select_dispatch(event_base *base,timeval *tv)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  short events;
  uint uVar4;
  int fd;
  void *pvVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  bool bVar9;
  
  piVar7 = (int *)base->evbase;
  if (piVar7[2] != 0) {
    iVar1 = piVar7[1];
    pvVar5 = event_mm_realloc_(*(void **)(piVar7 + 8),(long)iVar1);
    if (pvVar5 == (void *)0x0) {
      return -1;
    }
    *(void **)(piVar7 + 8) = pvVar5;
    pvVar5 = event_mm_realloc_(*(void **)(piVar7 + 10),(long)iVar1);
    if (pvVar5 == (void *)0x0) {
      return -1;
    }
    *(void **)(piVar7 + 10) = pvVar5;
    piVar7[2] = 0;
  }
  memcpy(*(void **)(piVar7 + 8),*(void **)(piVar7 + 4),(long)piVar7[1]);
  memcpy(*(void **)(piVar7 + 10),*(void **)(piVar7 + 6),(long)piVar7[1]);
  iVar1 = *piVar7;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  uVar4 = select(iVar1 + 1,*(fd_set **)(piVar7 + 8),*(fd_set **)(piVar7 + 10),(fd_set *)0x0,
                 (timeval *)tv);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (uVar4 == 0xffffffff) {
    piVar7 = __errno_location();
    if (*piVar7 != 4) {
      event_warn("select");
      return -1;
    }
    return 0;
  }
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("%s: select reports %d","select_dispatch",(ulong)uVar4);
  }
  fd = evutil_weakrand_range_(&base->weakrand_seed,iVar1 + 1);
  for (iVar8 = 0; iVar8 <= iVar1; iVar8 = iVar8 + 1) {
    bVar9 = iVar1 <= fd;
    fd = fd + 1;
    if (bVar9) {
      fd = 0;
    }
    uVar6 = 1L << ((byte)(fd % 0x40) & 0x3f);
    uVar2 = *(ulong *)(*(long *)(piVar7 + 8) + (long)(fd / 0x40) * 8);
    uVar3 = *(ulong *)(*(long *)(piVar7 + 10) + (long)(fd / 0x40) * 8);
    if ((uVar6 & (uVar3 | uVar2)) != 0) {
      bVar9 = (uVar2 & uVar6) != 0;
      events = bVar9 + 4 + (ushort)bVar9;
      if ((uVar3 & uVar6) == 0) {
        events = (ushort)bVar9 * 2;
      }
      evmap_io_active_(base,fd,events);
    }
  }
  return 0;
}

Assistant:

static int
select_dispatch(struct event_base *base, struct timeval *tv)
{
	int res=0, i, j, nfds;
	struct selectop *sop = base->evbase;

	check_selectop(sop);
	if (sop->resize_out_sets) {
		fd_set *readset_out=NULL, *writeset_out=NULL;
		size_t sz = sop->event_fdsz;
		if (!(readset_out = mm_realloc(sop->event_readset_out, sz)))
			return (-1);
		sop->event_readset_out = readset_out;
		if (!(writeset_out = mm_realloc(sop->event_writeset_out, sz))) {
			/* We don't free readset_out here, since it was
			 * already successfully reallocated. The next time
			 * we call select_dispatch, the realloc will be a
			 * no-op. */
			return (-1);
		}
		sop->event_writeset_out = writeset_out;
		sop->resize_out_sets = 0;
	}

	memcpy(sop->event_readset_out, sop->event_readset_in,
	       sop->event_fdsz);
	memcpy(sop->event_writeset_out, sop->event_writeset_in,
	       sop->event_fdsz);

	nfds = sop->event_fds+1;

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = select(nfds, sop->event_readset_out,
	    sop->event_writeset_out, NULL, tv);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	check_selectop(sop);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("select");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: select reports %d", __func__, res));

	check_selectop(sop);
	i = evutil_weakrand_range_(&base->weakrand_seed, nfds);
	for (j = 0; j < nfds; ++j) {
		if (++i >= nfds)
			i = 0;
		res = 0;
		if (FD_ISSET(i, sop->event_readset_out))
			res |= EV_READ;
		if (FD_ISSET(i, sop->event_writeset_out))
			res |= EV_WRITE;

		if (res == 0)
			continue;

		evmap_io_active_(base, i, res);
	}
	check_selectop(sop);

	return (0);
}